

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O3

bool markChildEdge(args *t,stateRecord *state,bool which)

{
  Mode MVar1;
  node *parent;
  seekRecord *psVar2;
  node *pnVar3;
  __pointer_type pnVar4;
  undefined7 in_register_00000011;
  node *oldChild;
  ulong which_00;
  edge helpeeEdge;
  edge local_68;
  edge local_48;
  
  MVar1 = state->mode;
  psVar2 = &state->successorRecord;
  if (MVar1 == INJECTION) {
    psVar2 = (seekRecord *)&state->targetEdge;
  }
  local_68.parent = (psVar2->lastEdge).parent;
  parent = (psVar2->lastEdge).child;
  local_68.which = (psVar2->lastEdge).which;
  local_68._17_7_ = *(undefined7 *)&(psVar2->lastEdge).field_0x11;
  which_00 = CONCAT71(in_register_00000011,which) & 0xffffffff;
  pnVar4 = parent->child[which_00]._M_b._M_p;
  pnVar3 = (node *)((ulong)pnVar4 & 0xfffffffffffffff0);
  local_68.child = parent;
  if (((ulong)pnVar4 & 4) != 0) {
    do {
      local_48.parent = parent;
      local_48.child = pnVar3;
      local_48.which = which;
      helpTargetNode(t,&local_48,state->depth + 1);
      pnVar4 = parent->child[which_00]._M_b._M_p;
      pnVar3 = (node *)((ulong)pnVar4 & 0xfffffffffffffff0);
    } while (((ulong)pnVar4 & 4) != 0);
  }
  if (((ulong)pnVar4 & 2) == 0) {
    if (((ulong)pnVar4 & 1) == 0) {
      oldChild = (node *)((ulong)pnVar4 | 8);
      if (((ulong)pnVar4 & 8) == 0) {
        oldChild = pnVar3;
      }
      CAS(parent,which_00,oldChild,
          (node *)((long)oldChild->child + ((ulong)(MVar1 == INJECTION) - 7)));
    }
    if (MVar1 != INJECTION) {
      return true;
    }
    helpSuccessorNode(t,&local_68,state->depth + 1);
  }
  else {
    if (MVar1 == INJECTION) {
      return true;
    }
    helpTargetNode(t,&local_68,state->depth + 1);
  }
  return false;
}

Assistant:

bool markChildEdge(struct args* t, struct stateRecord* state, bool which)
{
    struct node* node;
    struct edge edge;
    Flag flag;
    struct node* address;
    struct node* temp;
    bool n,i,d,p,result;
    struct edge helpeeEdge;
    struct node* oldValue;
    struct node* newValue;

    if(state->mode == INJECTION)
    {
        edge = state->targetEdge;
        flag = DELETE_FLAG;
    }
    else
    {
        edge = state->successorRecord.lastEdge;
        flag = PROMOTE_FLAG;
    }

    node = edge.child;

    while(true)
    {
        temp = node->child[which];
        n=isNull(temp);
        i=IFlagSet(temp);
        d=DFlagSet(temp);
        p=PFlagSet(temp);
        address=getAddress(temp);
        if(i)
        {
            fillTheEdge(&helpeeEdge,node,address,which);
            helpTargetNode(t,&helpeeEdge,state->depth+1);
            continue;
        }
        else if(d)
        {
            if(flag == PROMOTE_FLAG)
            {
                helpTargetNode(t,&edge,state->depth+1);
                return false;
            }
            else
            {
                return true;
            }
        }
        else if(p)
        {
            if(flag == DELETE_FLAG)
            {
                helpSuccessorNode(t,&edge,state->depth+1);
                return false;
            }
            else
            {
                return true;
            }
        }

        if(n)
        {
            oldValue = setNull(address);
        }
        else
        {
            oldValue = address;
        }

        if(flag == DELETE_FLAG)
        {
            newValue = setDFlag(oldValue);
        }
        else
        {
            newValue = setPFlag(oldValue);
        }
        result = CAS(node,which,oldValue,newValue);
        if(result)
        {
            break;
        }
    }
    return true;
}